

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj_model.c
# Opt level: O0

void free_mtl_lib(mtl_lib *mtl_lib)

{
  ulong local_18;
  size_t i;
  mtl_lib *mtl_lib_local;
  
  for (local_18 = 0; local_18 < mtl_lib->material_count; local_18 = local_18 + 1) {
    free(mtl_lib->materials[local_18].name);
    free(mtl_lib->materials[local_18].map_ka);
    free(mtl_lib->materials[local_18].map_kd);
    free(mtl_lib->materials[local_18].map_ks);
    free(mtl_lib->materials[local_18].map_ke);
    free(mtl_lib->materials[local_18].map_bump);
    free(mtl_lib->materials[local_18].map_d);
  }
  free(mtl_lib->materials);
  free(mtl_lib);
  return;
}

Assistant:

void free_mtl_lib(struct mtl_lib* mtl_lib) {
    for (size_t i = 0; i < mtl_lib->material_count; ++i) {
        free(mtl_lib->materials[i].name);
        free(mtl_lib->materials[i].map_ka);
        free(mtl_lib->materials[i].map_kd);
        free(mtl_lib->materials[i].map_ks);
        free(mtl_lib->materials[i].map_ke);
        free(mtl_lib->materials[i].map_bump);
        free(mtl_lib->materials[i].map_d);
    }
    free(mtl_lib->materials);
    free(mtl_lib);
}